

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alex_nodes.h
# Opt level: O0

void alex::AlexDataNode<int,_int,_alex::AlexCompare,_std::allocator<std::pair<int,_int>_>,_false>::
     build_model_sampling(V *values,int num_keys,LinearModel<int> *model,bool verbose)

{
  ostream *poVar1;
  byte in_CL;
  double *in_RDX;
  int in_ESI;
  LinearModelBuilder<int> *this;
  double dVar2;
  double dVar3;
  double rel_change_in_b;
  double abs_change_in_b;
  double rel_change_in_a;
  int j;
  int i_1;
  double prev_b;
  double prev_a;
  int i;
  LinearModelBuilder<int> builder;
  double sample_size;
  int step_size;
  LinearModel<int> *in_stack_ffffffffffffff18;
  LinearModelBuilder<int> *in_stack_ffffffffffffff20;
  int in_stack_ffffffffffffff48;
  int y;
  int in_stack_ffffffffffffff4c;
  int iVar4;
  LinearModelBuilder<int> *in_stack_ffffffffffffff50;
  LinearModelBuilder<int> *this_00;
  double local_a8;
  int local_9c;
  bool in_stack_ffffffffffffff9f;
  LinearModel<int> *in_stack_ffffffffffffffa0;
  int in_stack_ffffffffffffffac;
  V *in_stack_ffffffffffffffb0;
  double local_28;
  int local_20;
  
  if (in_ESI < 0x15) {
    build_model(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffac,in_stack_ffffffffffffffa0,
                in_stack_ffffffffffffff9f);
  }
  else {
    local_20 = 1;
    for (local_28 = (double)in_ESI; 10.0 <= local_28; local_28 = local_28 / 2.0) {
      local_20 = local_20 << 1;
    }
    local_20 = local_20 / 2;
    LinearModelBuilder<int>::LinearModelBuilder(in_stack_ffffffffffffff20,in_stack_ffffffffffffff18)
    ;
    for (local_9c = 0; local_9c < in_ESI; local_9c = local_20 + local_9c) {
      LinearModelBuilder<int>::add
                (in_stack_ffffffffffffff50,in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48);
    }
    LinearModelBuilder<int>::build((LinearModelBuilder<int> *)&stack0xffffffffffffff68);
    local_a8 = *in_RDX;
    this_00 = (LinearModelBuilder<int> *)in_RDX[1];
    if ((in_CL & 1) != 0) {
      poVar1 = std::operator<<((ostream *)&std::cout,"Build index, sample size: ");
      poVar1 = (ostream *)std::ostream::operator<<(poVar1,in_ESI / local_20);
      poVar1 = std::operator<<(poVar1," (a, b): (");
      poVar1 = (ostream *)std::ostream::operator<<(poVar1,local_a8);
      poVar1 = std::operator<<(poVar1,", ");
      poVar1 = (ostream *)std::ostream::operator<<(poVar1,(double)this_00);
      poVar1 = std::operator<<(poVar1,")");
      std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
    }
    while (1 < local_20) {
      local_20 = local_20 / 2;
      iVar4 = 0;
      while (iVar4 < in_ESI) {
        for (y = 1; iVar4 = local_20 + iVar4, y < 2 && iVar4 < in_ESI; y = y + 1) {
          LinearModelBuilder<int>::add(this_00,iVar4,y);
        }
      }
      this = (LinearModelBuilder<int> *)&stack0xffffffffffffff68;
      LinearModelBuilder<int>::build(this);
      iVar4 = (int)this;
      if ((local_a8 != 0.0) || (NAN(local_a8))) {
        local_a8 = (*in_RDX - local_a8) / local_a8;
        std::abs(iVar4);
      }
      else {
        local_a8 = (double)(*in_RDX != 0.0);
      }
      dVar2 = in_RDX[1] - (double)this_00;
      std::abs(iVar4);
      dVar3 = dVar2 / (double)this_00;
      std::abs(iVar4);
      if ((in_CL & 1) != 0) {
        poVar1 = std::operator<<((ostream *)&std::cout,"Build index, sample size: ");
        poVar1 = (ostream *)std::ostream::operator<<(poVar1,in_ESI / local_20);
        poVar1 = std::operator<<(poVar1," (a, b): (");
        poVar1 = (ostream *)std::ostream::operator<<(poVar1,*in_RDX);
        poVar1 = std::operator<<(poVar1,", ");
        poVar1 = (ostream *)std::ostream::operator<<(poVar1,in_RDX[1]);
        poVar1 = std::operator<<(poVar1,") (");
        poVar1 = (ostream *)std::ostream::operator<<(poVar1,local_a8);
        poVar1 = std::operator<<(poVar1,", ");
        poVar1 = (ostream *)std::ostream::operator<<(poVar1,dVar3);
        poVar1 = std::operator<<(poVar1,")");
        std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
      }
      if (local_a8 < 0.01) {
        if (dVar3 < 0.01) {
          return;
        }
        if (dVar2 < 0.5) {
          return;
        }
      }
      local_a8 = *in_RDX;
      this_00 = (LinearModelBuilder<int> *)in_RDX[1];
    }
  }
  return;
}

Assistant:

static void build_model_sampling(const V* values, int num_keys,
                                   LinearModel<T>* model,
                                   bool verbose = false) {
    const static int sample_size_lower_bound = 10;
    // If slope and intercept change by less than this much between samples,
    // return
    const static double rel_change_threshold = 0.01;
    // If intercept changes by less than this much between samples, return
    const static double abs_change_threshold = 0.5;
    // Increase sample size by this many times each iteration
    const static int sample_size_multiplier = 2;

    // If the number of keys is sufficiently small, we do not sample
    if (num_keys <= sample_size_lower_bound * sample_size_multiplier) {
      build_model(values, num_keys, model, false);
      return;
    }

    int step_size = 1;
    double sample_size = num_keys;
    while (sample_size >= sample_size_lower_bound) {
      sample_size /= sample_size_multiplier;
      step_size *= sample_size_multiplier;
    }
    step_size /= sample_size_multiplier;

    // Run with initial step size
    LinearModelBuilder<T> builder(model);
    for (int i = 0; i < num_keys; i += step_size) {
      builder.add(values[i].first, i);
    }
    builder.build();
    double prev_a = model->a_;
    double prev_b = model->b_;
    if (verbose) {
      std::cout << "Build index, sample size: " << num_keys / step_size
                << " (a, b): (" << prev_a << ", " << prev_b << ")" << std::endl;
    }

    // Keep decreasing step size (increasing sample size) until model does not
    // change significantly
    while (step_size > 1) {
      step_size /= sample_size_multiplier;
      // Need to avoid processing keys we already processed in previous samples
      int i = 0;
      while (i < num_keys) {
        i += step_size;
        for (int j = 1; (j < sample_size_multiplier) && (i < num_keys);
             j++, i += step_size) {
          builder.add(values[i].first, i);
        }
      }
      builder.build();

      double rel_change_in_a = prev_a == 0 ? (model->a_ != 0) 
                               : std::abs((model->a_ - prev_a) / prev_a);
      double abs_change_in_b = std::abs(model->b_ - prev_b);
      double rel_change_in_b = std::abs(abs_change_in_b / prev_b);
      if (verbose) {
        std::cout << "Build index, sample size: " << num_keys / step_size
                  << " (a, b): (" << model->a_ << ", " << model->b_ << ") ("
                  << rel_change_in_a << ", " << rel_change_in_b << ")"
                  << std::endl;
      }
      if (rel_change_in_a < rel_change_threshold &&
          (rel_change_in_b < rel_change_threshold ||
           abs_change_in_b < abs_change_threshold)) {
        return;
      }
      prev_a = model->a_;
      prev_b = model->b_;
    }
  }